

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_script.cpp
# Opt level: O3

void __thiscall
cfdcapi_script_SingleKeyTaproot_Test::TestBody(cfdcapi_script_SingleKeyTaproot_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  char *tree_str;
  AssertionResult gtest_ar_;
  int ret;
  AssertionResult gtest_ar;
  char *witness_program;
  void *handle;
  void *tree_handle;
  char *control_block;
  char *leaf_hash;
  int tmp_ret;
  AssertHelper local_90;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  AssertHelper local_78;
  int local_6c;
  string local_68;
  AssertHelper local_48;
  AssertHelper local_40;
  void *local_38;
  AssertHelper local_30;
  char *local_28;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  int local_14;
  
  local_38 = (void *)0x0;
  local_6c = CfdCreateHandle(&local_38);
  local_88.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_88.ptr_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_68,"kCfdSuccess","ret",(CfdErrorCode *)&local_88,&local_6c);
  if ((char)local_68._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_88);
    if ((undefined8 *)local_68._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_68._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x336,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_88.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_88.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_68._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_88.ptr_._0_1_ = local_38 != (void *)0x0;
  local_80.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 == (void *)0x0) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)&local_88,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x337,(char *)CONCAT71(local_68._M_dataplus._M_p._1_7_,
                                       (char)local_68._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_68._M_dataplus._M_p._1_7_,(char)local_68._M_dataplus._M_p) !=
        &local_68.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_68._M_dataplus._M_p._1_7_,(char)local_68._M_dataplus._M_p));
    }
    if (local_90.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_90.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_90.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_30.data_ = (AssertHelperData *)0x0;
  local_6c = CfdInitializeTaprootScriptTree(local_38,&local_30.data_);
  local_88.ptr_ = local_88.ptr_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_68,"kCfdSuccess","ret",(CfdErrorCode *)&local_88,&local_6c);
  if ((char)local_68._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_88);
    if ((undefined8 *)local_68._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_68._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x33b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_88.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_88.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_68._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_6c == 0) {
    local_40.data_ = (AssertHelperData *)0x0;
    local_20.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_28 = (char *)0x0;
    local_6c = CfdGetTaprootScriptTreeHash
                         (local_38,local_30.data_,
                          "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
                          (char **)&local_40,(char **)&local_20,&local_28);
    local_88.ptr_ = local_88.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_68,"kCfdSuccess","ret",(CfdErrorCode *)&local_88,&local_6c);
    if ((char)local_68._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_88);
      if ((undefined8 *)local_68._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_68._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x349,pcVar2);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if (local_88.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_88.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_88.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_68._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_6c == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_68,
                 "\"cc3b1538e0c8144375f71e848b12d609d743992fddfc60dd6ca9b33b8392f27a\"",
                 "witness_program",
                 "cc3b1538e0c8144375f71e848b12d609d743992fddfc60dd6ca9b33b8392f27a",
                 (char *)local_40.data_);
      if ((char)local_68._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_88);
        if ((undefined8 *)local_68._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_68._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x34d,pcVar2);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if (local_88.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_88.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_88.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_68._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_88.ptr_ = local_20.ptr_;
      local_90.data_ = (AssertHelperData *)0x0;
      testing::internal::CmpHelperEQ<char*,char*>
                ((internal *)&local_68,"nullptr","leaf_hash",(char **)&local_90,(char **)&local_88);
      if ((char)local_68._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_88);
        if ((undefined8 *)local_68._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_68._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x34e,pcVar2);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if (local_88.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_88.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_88.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_68._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_68,
                 "\"c11777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\"",
                 "control_block",
                 "c11777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",local_28);
      if ((char)local_68._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_88);
        if ((undefined8 *)local_68._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_68._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x351,pcVar2);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if (local_88.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_88.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_88.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_68._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer((char *)local_40.data_);
      local_40.data_ = (AssertHelperData *)0x0;
      CfdFreeStringBuffer((char *)local_20.ptr_);
      local_20.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
      CfdFreeStringBuffer(local_28);
      local_28 = (char *)0x0;
    }
    local_88.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_6c = CfdGetTaprootTweakedPrivkey
                         (local_38,local_30.data_,
                          "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27",
                          (char **)&local_88);
    local_90.data_ = local_90.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_68,"kCfdSuccess","ret",(CfdErrorCode *)&local_90,&local_6c);
    if ((char)local_68._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_90);
      if ((undefined8 *)local_68._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_68._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x35e,pcVar2);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if (local_90.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_90.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_90.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_68._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_6c == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_68,
                 "\"3a56ec9129732312a78db4b845138a3180c102621d7381ae6e6a5d530f14856a\"",
                 "tweaked_privkey",
                 "3a56ec9129732312a78db4b845138a3180c102621d7381ae6e6a5d530f14856a",
                 (char *)local_88.ptr_);
      if ((char)local_68._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_90);
        if ((undefined8 *)local_68._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_68._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x362,pcVar2);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if (local_90.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_90.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_90.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_68._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer((char *)local_88.ptr_);
      local_88.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
    local_90.data_ = (AssertHelperData *)0x0;
    local_6c = CfdGetTaprootScriptTreeSrting(local_38,local_30.data_,(char **)&local_90);
    local_78.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_68,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,&local_6c);
    if ((char)local_68._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_78);
      if ((undefined8 *)local_68._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_68._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x369,pcVar2);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (CONCAT44(local_78.data_._4_4_,local_78.data_._0_4_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && ((long *)CONCAT44(local_78.data_._4_4_,local_78.data_._0_4_) != (long *)0x0))
        {
          (**(code **)(*(long *)CONCAT44(local_78.data_._4_4_,local_78.data_._0_4_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_68._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_6c == 0) {
      pcVar2 = "";
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_68,"\"\"","tree_str","",(char *)local_90.data_);
      if ((char)local_68._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_78);
        if ((undefined8 *)local_68._M_string_length != (undefined8 *)0x0) {
          pcVar2 = *(char **)local_68._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x36b,pcVar2);
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_48);
        if (CONCAT44(local_78.data_._4_4_,local_78.data_._0_4_) != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             ((long *)CONCAT44(local_78.data_._4_4_,local_78.data_._0_4_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_78.data_._4_4_,local_78.data_._0_4_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_68._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer((char *)local_90.data_);
      local_90.data_ = (AssertHelperData *)0x0;
    }
    local_14 = CfdFreeTaprootScriptTreeHandle(local_38,local_30.data_);
    local_78.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_68,"kCfdSuccess","tmp_ret",(CfdErrorCode *)&local_78,&local_14);
    if ((char)local_68._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_78);
      if ((undefined8 *)local_68._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_68._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x371,pcVar2);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (CONCAT44(local_78.data_._4_4_,local_78.data_._0_4_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && ((long *)CONCAT44(local_78.data_._4_4_,local_78.data_._0_4_) != (long *)0x0))
        {
          (**(code **)(*(long *)CONCAT44(local_78.data_._4_4_,local_78.data_._0_4_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_68._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  local_6c = CfdGetLastErrorCode(local_38);
  if (local_6c != 0) {
    local_88.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_6c = CfdGetLastErrorMessage(local_38,(char **)&local_88);
    local_90.data_ = local_90.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_68,"kCfdSuccess","ret",(CfdErrorCode *)&local_90,&local_6c);
    if ((char)local_68._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_90);
      if ((undefined8 *)local_68._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_68._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x378,pcVar2);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (local_90.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_90.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_90.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_68._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pcVar2 = "";
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_68,"\"\"","str_buffer","",(char *)local_88.ptr_);
    if ((char)local_68._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_90);
      if ((undefined8 *)local_68._M_string_length != (undefined8 *)0x0) {
        pcVar2 = *(char **)local_68._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x379,pcVar2);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (local_90.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_90.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_90.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_68._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    CfdFreeStringBuffer((char *)local_88.ptr_);
  }
  local_6c = CfdFreeHandle(local_38);
  local_88.ptr_ = local_88.ptr_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_68,"kCfdSuccess","ret",(CfdErrorCode *)&local_88,&local_6c);
  if ((char)local_68._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_88);
    if ((undefined8 *)local_68._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_68._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x37f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_88.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_88.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_68._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(cfdcapi_script, SingleKeyTaproot) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  void* tree_handle = nullptr;
  ret = CfdInitializeTaprootScriptTree(handle, &tree_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    // set empty branch. or not set.
    // ret = CfdSetInitialTapBranchByHash(handle, tree_handle, "");
    // EXPECT_EQ(kCfdSuccess, ret);

    char* witness_program = nullptr;
    char* leaf_hash = nullptr;
    char* control_block = nullptr;
    ret = CfdGetTaprootScriptTreeHash(handle, tree_handle,
        "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
        &witness_program,
        &leaf_hash,
        &control_block);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(
        "cc3b1538e0c8144375f71e848b12d609d743992fddfc60dd6ca9b33b8392f27a",
        witness_program);
      EXPECT_EQ(nullptr, leaf_hash);  // current is tapbranch only.
      EXPECT_STREQ(
        "c11777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
        control_block);
      CfdFreeStringBuffer(witness_program);
      witness_program = nullptr;
      CfdFreeStringBuffer(leaf_hash);
      leaf_hash = nullptr;
      CfdFreeStringBuffer(control_block);
      control_block = nullptr;
    }

    char* tweaked_privkey = nullptr;
    ret = CfdGetTaprootTweakedPrivkey(handle, tree_handle,
        "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27",
        &tweaked_privkey);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(
          "3a56ec9129732312a78db4b845138a3180c102621d7381ae6e6a5d530f14856a",
          tweaked_privkey);
      CfdFreeStringBuffer(tweaked_privkey);
      tweaked_privkey = nullptr;
    }

    char* tree_str = nullptr;
    ret = CfdGetTaprootScriptTreeSrting(handle, tree_handle, &tree_str);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("", tree_str);  // empty tapbranch
      CfdFreeStringBuffer(tree_str);
      tree_str = nullptr;
    }

    int tmp_ret = CfdFreeTaprootScriptTreeHandle(handle, tree_handle);
    EXPECT_EQ(kCfdSuccess, tmp_ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}